

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator>(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_f1;
  basic_string_view<char,_std::char_traits<char>_> local_f0 [2];
  string local_d0;
  string local_b0 [32];
  string local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [40];
  
  local_60.data_ = (const_pointer)**(undefined8 **)this;
  local_60.size_ = (*(undefined8 **)this)[1];
  local_70.data_ = rhs->data_;
  local_70.size_ = rhs->size_;
  bVar1 = nonstd::sv_lite::operator>(&local_60,&local_70);
  this_00 = *(lest **)this;
  std::__cxx11::string::string(local_90,">",&local_f1);
  std::__cxx11::string::string((string *)local_f0,local_90);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_d0,this_00,local_f0,(string *)rhs,in_R8);
  std::__cxx11::string::string(local_b0,(string *)&local_d0);
  local_50[0] = bVar1;
  std::__cxx11::string::string((string *)(local_50 + 8),local_b0);
  result::result(__return_storage_ptr__,(result *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }